

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

in_port_t ngx_inet_get_port(sockaddr *sa)

{
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  sockaddr *sa_local;
  
  if (sa->sa_family == 1) {
    sa_local._6_2_ = 0;
  }
  else if (sa->sa_family == 10) {
    sa_local._6_2_ = ntohs(*(uint16_t *)sa->sa_data);
  }
  else {
    sa_local._6_2_ = ntohs(*(uint16_t *)sa->sa_data);
  }
  return sa_local._6_2_;
}

Assistant:

in_port_t
ngx_inet_get_port(struct sockaddr *sa)
{
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin6;
#endif

    switch (sa->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) sa;
        return ntohs(sin6->sin6_port);
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:
        return 0;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) sa;
        return ntohs(sin->sin_port);
    }
}